

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest11InhibitPolicyMapping_::
Section11InvalidSelfIssuedinhibitPolicyMappingTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section11InvalidSelfIssuedinhibitPolicyMappingTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.11.9";
  local_88.should_validate = false;
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<6ul,4ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006bbc10,(char *(*) [6])&PTR_anon_var_dwarf_3f4b94_006bbc40,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest11InhibitPolicyMapping,
                     Section11InvalidSelfIssuedinhibitPolicyMappingTest9) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitPolicyMapping1P1CACert",
                               "inhibitPolicyMapping1P1SelfIssuedCACert",
                               "inhibitPolicyMapping1P1subCACert",
                               "inhibitPolicyMapping1P1subsubCACert",
                               "InvalidSelfIssuedinhibitPolicyMappingTest9EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "inhibitPolicyMapping1P1CACRL",
      "inhibitPolicyMapping1P1subCACRL", "inhibitPolicyMapping1P1subsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.11.9";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}